

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O2

primitive_dictionary_entry_t * __thiscall
duckdb::
PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>::
Lookup(PrimitiveDictionary<duckdb::hugeint_t,_duckdb::ParquetUUIDTargetType,_duckdb::ParquetUUIDOperator>
       *this,hugeint_t *value)

{
  char cVar1;
  ulong uVar2;
  primitive_dictionary_entry_t *ppVar3;
  
  uVar2 = duckdb::Hash<duckdb::hugeint_t>(*value);
  do {
    uVar2 = uVar2 & this->capacity_mask;
    ppVar3 = this->dictionary;
    if (ppVar3[uVar2].index == 0xffffffff) {
LAB_002be0fb:
      return ppVar3 + uVar2;
    }
    cVar1 = duckdb::hugeint_t::operator!=(&ppVar3[uVar2].value,value);
    if (cVar1 == '\0') {
      ppVar3 = this->dictionary;
      goto LAB_002be0fb;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}